

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<int> __l_09;
  initializer_list<int> __l_10;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_11;
  allocator_type local_465;
  allocator_type local_464;
  allocator_type local_463;
  allocator_type local_462;
  allocator_type local_461;
  allocator_type local_460;
  allocator_type local_45f;
  allocator_type local_45e;
  allocator_type local_45d;
  allocator_type local_45c;
  allocator_type local_45b;
  allocator_type local_45a;
  allocator_type local_459;
  vector<astar::Point,_std::allocator<astar::Point>_> path;
  Map maze;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_400;
  AStar aStar;
  vector<int,_std::allocator<int>_> local_358;
  vector<int,_std::allocator<int>_> local_340;
  vector<int,_std::allocator<int>_> local_328;
  vector<int,_std::allocator<int>_> local_310;
  vector<int,_std::allocator<int>_> local_2f8;
  vector<int,_std::allocator<int>_> local_2e0;
  duration<long,_std::ratio<1L,_1L>_> local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  Point end;
  Point start;
  AStar as;
  int local_1b8 [98];
  
  as.closeZone._M_h._M_buckets = &as.closeZone._M_h._M_single_bucket;
  as.map.map.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  as.map.m = 0;
  as.map.n = 0;
  as.map.map.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  as.map.map.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  as.moveType = D8;
  as.openZone.c.
  super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  as.openZone.c.
  super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  as.openZone.c.
  super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  as.closeZone._M_h._M_bucket_count = 1;
  as.closeZone._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  as.closeZone._M_h._M_element_count = 0;
  as.closeZone._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  as.closeZone._M_h._M_rehash_policy._M_next_resize = 0;
  as.closeZone._M_h._M_single_bucket = (__node_base_ptr)0x0;
  path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __l._M_len = 0xc;
  __l._M_array = (iterator)&path;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&aStar,__l,&local_459);
  start.x = 0;
  start.y = 0;
  __l_00._M_len = 0xc;
  __l_00._M_array = &start.x;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&aStar.map.m,__l_00,&local_45a);
  end.x = 0;
  end.y = 0;
  __l_01._M_len = 0xc;
  __l_01._M_array = &end.x;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &aStar.openZone.c.
              super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>.
              _M_impl.super__Vector_impl_data._M_finish,__l_01,&local_45b);
  local_2a8 = 0;
  uStack_2a0 = 1;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2c8.__r = 0;
  uStack_2c0 = 1;
  __l_02._M_len = 0xc;
  __l_02._M_array = (iterator)&local_2c8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&aStar.closeZone,__l_02,&local_45c);
  local_1b8[0x5c] = 0;
  local_1b8[0x5d] = 0;
  local_1b8[0x5e] = 1;
  local_1b8[0x5f] = 0;
  local_1b8[0x58] = 0;
  local_1b8[0x59] = 0;
  local_1b8[0x5a] = 1;
  local_1b8[0x5b] = 0;
  local_1b8[0x54] = 0;
  local_1b8[0x55] = 0;
  local_1b8[0x56] = 1;
  local_1b8[0x57] = 0;
  __l_03._M_len = 0xc;
  __l_03._M_array = local_1b8 + 0x54;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&aStar.closeZone._M_h._M_element_count,__l_03,
             &local_45d);
  local_1b8[0x50] = 0;
  local_1b8[0x51] = 0;
  local_1b8[0x52] = 1;
  local_1b8[0x53] = 0;
  local_1b8[0x4c] = 0;
  local_1b8[0x4d] = 0;
  local_1b8[0x4e] = 1;
  local_1b8[0x4f] = 0;
  local_1b8[0x48] = 0;
  local_1b8[0x49] = 0;
  local_1b8[0x4a] = 0;
  local_1b8[0x4b] = 0;
  __l_04._M_len = 0xc;
  __l_04._M_array = local_1b8 + 0x48;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&aStar.closeZone._M_h._M_single_bucket,__l_04,
             &local_45e);
  local_1b8[0x44] = 0;
  local_1b8[0x45] = 0;
  local_1b8[0x46] = 0;
  local_1b8[0x47] = 0;
  local_1b8[0x40] = 0;
  local_1b8[0x41] = 0;
  local_1b8[0x42] = 1;
  local_1b8[0x43] = 0;
  local_1b8[0x3c] = 0;
  local_1b8[0x3d] = 0;
  local_1b8[0x3e] = 1;
  local_1b8[0x3f] = 0;
  __l_05._M_len = 0xc;
  __l_05._M_array = local_1b8 + 0x3c;
  std::vector<int,_std::allocator<int>_>::vector(&local_358,__l_05,&local_45f);
  local_1b8[0x38] = 0;
  local_1b8[0x39] = 0;
  local_1b8[0x3a] = 1;
  local_1b8[0x3b] = 0;
  local_1b8[0x34] = 0;
  local_1b8[0x35] = 0;
  local_1b8[0x36] = 1;
  local_1b8[0x37] = 0;
  local_1b8[0x30] = 0;
  local_1b8[0x31] = 0;
  local_1b8[0x32] = 1;
  local_1b8[0x33] = 0;
  __l_06._M_len = 0xc;
  __l_06._M_array = local_1b8 + 0x30;
  std::vector<int,_std::allocator<int>_>::vector(&local_340,__l_06,&local_460);
  local_1b8[0x2c] = 0;
  local_1b8[0x2d] = 0;
  local_1b8[0x2e] = 1;
  local_1b8[0x2f] = 0;
  local_1b8[0x28] = 0;
  local_1b8[0x29] = 0;
  local_1b8[0x2a] = 0;
  local_1b8[0x2b] = 0;
  local_1b8[0x24] = 0;
  local_1b8[0x25] = 0;
  local_1b8[0x26] = 1;
  local_1b8[0x27] = 0;
  __l_07._M_len = 0xc;
  __l_07._M_array = local_1b8 + 0x24;
  std::vector<int,_std::allocator<int>_>::vector(&local_328,__l_07,&local_461);
  local_1b8[0x20] = 1;
  local_1b8[0x21] = 1;
  local_1b8[0x22] = 1;
  local_1b8[0x23] = 0;
  local_1b8[0x1c] = 1;
  local_1b8[0x1d] = 0;
  local_1b8[0x1e] = 0;
  local_1b8[0x1f] = 1;
  local_1b8[0x18] = 0;
  local_1b8[0x19] = 0;
  local_1b8[0x1a] = 1;
  local_1b8[0x1b] = 1;
  __l_08._M_len = 0xc;
  __l_08._M_array = local_1b8 + 0x18;
  std::vector<int,_std::allocator<int>_>::vector(&local_310,__l_08,&local_462);
  local_1b8[0x14] = 0;
  local_1b8[0x15] = 0;
  local_1b8[0x16] = 0;
  local_1b8[0x17] = 0;
  local_1b8[0x10] = 0;
  local_1b8[0x11] = 0;
  local_1b8[0x12] = 0;
  local_1b8[0x13] = 0;
  local_1b8[0xc] = 0;
  local_1b8[0xd] = 0;
  local_1b8[0xe] = 0;
  local_1b8[0xf] = 0;
  __l_09._M_len = 0xc;
  __l_09._M_array = local_1b8 + 0xc;
  std::vector<int,_std::allocator<int>_>::vector(&local_2f8,__l_09,&local_463);
  local_1b8[8] = 0;
  local_1b8[9] = 0;
  local_1b8[10] = 0;
  local_1b8[0xb] = 0;
  local_1b8[4] = 0;
  local_1b8[5] = 0;
  local_1b8[6] = 0;
  local_1b8[7] = 0;
  local_1b8[0] = 0;
  local_1b8[1] = 0;
  local_1b8[2] = 0;
  local_1b8[3] = 0;
  __l_10._M_len = 0xc;
  __l_10._M_array = local_1b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_2e0,__l_10,&local_464);
  __l_11._M_len = 0xc;
  __l_11._M_array = (iterator)&aStar;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_400,__l_11,&local_465);
  astar::Map::Map(&maze,&local_400);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_400);
  lVar2 = 0x108;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)
               ((long)&aStar.map.map.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  aStar.closeZone._M_h._M_buckets = &aStar.closeZone._M_h._M_single_bucket;
  aStar.map.map.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aStar.map.m = 0;
  aStar.map.n = 0;
  aStar.map.map.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  aStar.map.map.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  aStar.moveType = D8;
  aStar.openZone.c.
  super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  aStar.openZone.c.
  super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  aStar.openZone.c.
  super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aStar.closeZone._M_h._M_bucket_count = 1;
  aStar.closeZone._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  aStar.closeZone._M_h._M_element_count = 0;
  aStar.closeZone._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  aStar.closeZone._M_h._M_rehash_policy._M_next_resize = 0;
  aStar.closeZone._M_h._M_single_bucket = (__node_base_ptr)0x0;
  astar::AStar::LoadMap(&aStar,&maze);
  start.x = 0;
  start.y = 0;
  end.x = 0xb;
  end.y = 0xb;
  DefPoint(&maze,&start,&end);
  astar::AStar::FindPath(&path,&aStar,&start,&end);
  PrintMaze(&maze);
  if (path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
      super__Vector_impl_data._M_start ==
      path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar1 = std::operator<<((ostream *)&std::cout,"path not found");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    for (uVar4 = 0; uVar3 = (ulong)uVar4,
        uVar3 < (ulong)((long)path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
      local_2c8.__r = 1;
      std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_2c8);
      ClearScreen(maze.n + 1);
      astar::Map::Assign(&maze,path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar3,4);
      PrintMaze(&maze);
      ClearScreen(1);
      poVar1 = std::operator<<((ostream *)&std::cout,"(");
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (poVar1,path.
                                 super__Vector_base<astar::Point,_std::allocator<astar::Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar3].x);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (poVar1,path.
                                 super__Vector_base<astar::Point,_std::allocator<astar::Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar3].y);
      poVar1 = std::operator<<(poVar1,")");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    ClearScreen(maze.n + 2);
    PrintMaze(&maze);
    for (uVar4 = 0; uVar3 = (ulong)uVar4,
        uVar3 < ((long)path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) - 1U; uVar4 = uVar4 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,"(");
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (poVar1,path.
                                 super__Vector_base<astar::Point,_std::allocator<astar::Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar3].x);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (poVar1,path.
                                 super__Vector_base<astar::Point,_std::allocator<astar::Point>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar3].y);
      std::operator<<(poVar1,") -> ");
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"(");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar3].x);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar3].y);
    poVar1 = std::operator<<(poVar1,")");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::_Vector_base<astar::Point,_std::allocator<astar::Point>_>::~_Vector_base
            (&path.super__Vector_base<astar::Point,_std::allocator<astar::Point>_>);
  astar::AStar::~AStar(&aStar);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&maze.map);
  astar::AStar::~AStar(&as);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    astar::AStar as(astar::D8);

    astar::Map maze({{0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0},
                     {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0},
                     {0, 0, 1, 1, 1, 1, 0, 0, 1, 1, 1, 0},
                     {0, 0, 1, 0, 0, 0, 0, 0, 0, 0, 1, 0},
                     {0, 0, 1, 0, 0, 0, 1, 0, 0, 0, 1, 0},
                     {0, 0, 0, 0, 0, 0, 1, 0, 0, 0, 1, 0},
                     {0, 0, 1, 0, 0, 0, 1, 0, 0, 0, 0, 0},
                     {0, 0, 1, 0, 0, 0, 1, 0, 0, 0, 1, 0},
                     {0, 0, 1, 0, 0, 0, 0, 0, 0, 0, 1, 0},
                     {0, 0, 1, 1, 1, 0, 0, 1, 1, 1, 1, 0},
                     {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0},
                     {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0}});

    astar::AStar aStar(astar::D8);
    aStar.LoadMap(maze);

    astar::Point start = {0, 0};
    astar::Point end = {11, 11};
    DefPoint(maze, start, end);
    auto path = aStar.FindPath(start, end);

    // display the maze
    uint32_t count = 0;
    PrintMaze(maze);
    if (path.empty()) {
        std::cout << "path not found" << std::endl;
        return 0;
    }
    while (count < path.size()) {
        std::this_thread::sleep_for(1s);
        ClearScreen(maze.Height() + 1);
        maze.Assign(path[count], 4);
        PrintMaze(maze);
        ClearScreen(1);
        std::cout << "(" << path[count].x << ", " << path[count].y << ")" << std::endl;
        count++;
    }
    ClearScreen(maze.Height() + 2);
    PrintMaze(maze);
    uint32_t i = 0;
    for (; i < (path.size() - 1); i++) {
        std::cout << "(" << path[i].x << ", " << path[i].y << ") -> ";
    }
    std::cout << "(" << path[i].x << ", " << path[i].y << ")" << std::endl;
    return 0;
}